

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateCppModuleUniqueHandleUsings_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this)

{
  bool bVar1;
  type *__rhs;
  type *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  reference local_158;
  ExtensionData *extension;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  *__range1_1;
  reference local_118;
  FeatureData *feature;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
  *__range1;
  anon_class_16_2_7e9d40f7 generateUsingsAndProtection;
  type *smartHandleLeave;
  type *smartHandleEnter;
  string local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  allocator<char> local_4e;
  byte local_4d;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string usingTemplate;
  VulkanHppGenerator *this_local;
  string *uniqueHandleUsings;
  
  usingTemplate.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"  using VULKAN_HPP_NAMESPACE::Unique${handleName};\n",&local_39);
  std::allocator<char>::~allocator(&local_39);
  local_4d = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "\n  //======================\n  //=== UNIQUE HANDLEs ===\n  //======================\n"
             ,&local_4e);
  std::allocator<char>::~allocator(&local_4e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"VULKAN_HPP_NO_SMART_HANDLE",
             (allocator<char> *)((long)&smartHandleEnter + 7));
  generateProtection(&local_90,this,&local_b0,false);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&smartHandleEnter + 7));
  __rhs = std::get<0ul,std::__cxx11::string,std::__cxx11::string>(&local_90);
  __lhs = std::get<1ul,std::__cxx11::string,std::__cxx11::string>(&local_90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &generateUsingsAndProtection.this,"\n",__rhs);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &generateUsingsAndProtection.this);
  std::__cxx11::string::~string((string *)&generateUsingsAndProtection.this);
  __range1 = (vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
              *)local_38;
  generateUsingsAndProtection.usingTemplate = &this->m_api;
  __end1 = std::
           vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ::begin(&this->m_features);
  feature = (FeatureData *)
            std::
            vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
            ::end(&this->m_features);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_VulkanHppGenerator::FeatureData_*,_std::vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>_>
                      (&__end1,(__normal_iterator<const_VulkanHppGenerator::FeatureData_*,_std::vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>_>
                                *)&feature);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_118 = __gnu_cxx::
                __normal_iterator<const_VulkanHppGenerator::FeatureData_*,_std::vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>_>
                ::operator*(&__end1);
    generateCppModuleUniqueHandleUsings::anon_class_16_2_7e9d40f7::operator()
              ((string *)&__range1_1,(anon_class_16_2_7e9d40f7 *)&__range1,&local_118->requireData,
               &local_118->name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1);
    std::__cxx11::string::~string((string *)&__range1_1);
    __gnu_cxx::
    __normal_iterator<const_VulkanHppGenerator::FeatureData_*,_std::vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
             ::begin(&this->m_extensions);
  extension = (ExtensionData *)
              std::
              vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
              ::end(&this->m_extensions);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
                      (&__end1_1,
                       (__normal_iterator<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
                        *)&extension);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_158 = __gnu_cxx::
                __normal_iterator<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
                ::operator*(&__end1_1);
    generateCppModuleUniqueHandleUsings::anon_class_16_2_7e9d40f7::operator()
              (&local_178,(anon_class_16_2_7e9d40f7 *)&__range1,&local_158->requireData,
               &local_158->name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    __gnu_cxx::
    __normal_iterator<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
    ::operator++(&__end1_1);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,"  using VULKAN_HPP_NAMESPACE::UniqueHandleTraits;\n");
  std::operator+(&local_198,__lhs,"\n");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  local_4d = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_90);
  if ((local_4d & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCppModuleUniqueHandleUsings() const
{
  auto const usingTemplate                        = std::string{ R"(  using VULKAN_HPP_NAMESPACE::Unique${handleName};
)" };
  auto       uniqueHandleUsings                   = std::string{ R"(
  //======================
  //=== UNIQUE HANDLEs ===
  //======================
)" };
  auto const [smartHandleEnter, smartHandleLeave] = generateProtection( "VULKAN_HPP_NO_SMART_HANDLE", false );

  uniqueHandleUsings += "\n" + smartHandleEnter;

  auto const generateUsingsAndProtection = [&usingTemplate, this]( std::vector<RequireData> const & requireData, std::string const & title )
  {
    auto usings = std::string{};
    for ( auto const & require : requireData )
    {
      for ( auto const & type : require.types )
      {
        if ( auto const & handleIt = m_handles.find( type.name ); handleIt != m_handles.end() && !handleIt->second.deleteCommand.empty() )
        {
          usings += replaceWithMap( usingTemplate, { { "handleName", stripPrefix( handleIt->first, "Vk" ) } } );
        }
      }
    }
    return addTitleAndProtection( title, usings );
  };

  for ( auto const & feature : m_features )
  {
    uniqueHandleUsings += generateUsingsAndProtection( feature.requireData, feature.name );
  }

  for ( auto const & extension : m_extensions )
  {
    uniqueHandleUsings += generateUsingsAndProtection( extension.requireData, extension.name );
  }

  uniqueHandleUsings += R"(  using VULKAN_HPP_NAMESPACE::UniqueHandleTraits;
)";

  uniqueHandleUsings += smartHandleLeave + "\n";

  return uniqueHandleUsings;
}